

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserTest_StopAfterOmittedSyntaxIdentifier_Test::
~ParserTest_StopAfterOmittedSyntaxIdentifier_Test
          (ParserTest_StopAfterOmittedSyntaxIdentifier_Test *this)

{
  ParserTest_StopAfterOmittedSyntaxIdentifier_Test *this_local;
  
  ~ParserTest_StopAfterOmittedSyntaxIdentifier_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParserTest, StopAfterOmittedSyntaxIdentifier) {
  SetupParser(
      "// blah\n"
      "this line will not be parsed\n");
  parser_->SetStopAfterSyntaxIdentifier(true);
  EXPECT_TRUE(parser_->Parse(input_.get(), nullptr));
  EXPECT_EQ("", error_collector_.text_);
  EXPECT_EQ("", parser_->GetSyntaxIdentifier());
}